

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

bool __thiscall cmCTestMemCheckHandler::InitializeMemoryChecking(cmCTestMemCheckHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  ostream *poVar6;
  char *pcVar7;
  bool local_10a1;
  string local_1070 [32];
  undefined1 local_1050 [8];
  ostringstream cmCTestLog_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e78;
  undefined1 local_e58 [8];
  string outputFile_1;
  string local_e30;
  string local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  string local_da8;
  allocator<char> local_d81;
  string local_d80;
  string local_d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d40;
  allocator<char> local_d19;
  string local_d18;
  string local_cf8;
  undefined1 local_cd8 [8];
  string suppressionsOption;
  string extraOptions;
  string envVar;
  undefined1 local_c58 [8];
  string dpbdFile;
  string outputFile;
  allocator<char> local_bf1;
  string local_bf0;
  string local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  undefined4 local_b8c;
  string local_b88 [39];
  allocator<char> local_b61;
  string local_b60;
  string local_b40;
  undefined1 local_b20 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_9a1;
  string local_9a0;
  string local_980;
  allocator<char> local_959;
  string local_958;
  string local_938;
  string local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8d8;
  allocator<char> local_8b9;
  string local_8b8;
  string local_898;
  allocator<char> local_871;
  string local_870;
  string local_850;
  allocator<char> local_829;
  string local_828;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  string local_7c0;
  undefined1 local_7a0 [8];
  string memoryTesterOptions;
  ostringstream local_760 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_5e1;
  string local_5e0;
  undefined1 local_5c0 [8];
  string checkType;
  string local_598;
  string local_578;
  allocator<char> local_551;
  string local_550;
  string local_530;
  allocator<char> local_509;
  string local_508;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  string local_458;
  allocator<char> local_431;
  string local_430;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  string local_380;
  allocator<char> local_359;
  string local_358;
  string local_338;
  allocator<char> local_311;
  string local_310;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  allocator<char> local_161;
  string local_160;
  string local_140;
  byte local_11c;
  byte local_11b;
  byte local_11a;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  string testerName;
  string local_b0;
  string local_90;
  allocator<char> local_59;
  string local_58;
  string local_38;
  cmCTestMemCheckHandler *local_18;
  cmCTestMemCheckHandler *this_local;
  
  local_18 = this;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"MemoryCheckCommand",&local_59);
  cmCTest::GetCTestConfiguration(&local_38,pcVar1,&local_58);
  bVar2 = cmsys::SystemTools::FileExists(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"MemoryCheckCommand",
               (allocator<char> *)(testerName.field_2._M_local_buf + 0xf));
    cmCTest::GetCTestConfiguration(&local_90,pcVar1,&local_b0);
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)(testerName.field_2._M_local_buf + 0xf));
    cmsys::SystemTools::GetFilenameName((string *)local_d8,&this->MemoryTester);
    lVar4 = std::__cxx11::string::find(local_d8,0x920f06);
    local_11a = 0;
    local_11b = 0;
    local_11c = 0;
    local_10a1 = true;
    if (lVar4 == -1) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      local_11a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"MemoryCheckType",&local_119);
      local_11b = 1;
      cmCTest::GetCTestConfiguration(&local_f8,pcVar1,&local_118);
      local_11c = 1;
      local_10a1 = std::operator==(&local_f8,"Valgrind");
    }
    if ((local_11c & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_f8);
    }
    if ((local_11b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_118);
    }
    if ((local_11a & 1) != 0) {
      std::allocator<char>::~allocator(&local_119);
    }
    if (local_10a1 == false) {
      lVar4 = std::__cxx11::string::find(local_d8,0x920f1f);
      if (lVar4 == -1) {
        lVar4 = std::__cxx11::string::find(local_d8,0x920f26);
        if (lVar4 == -1) {
          this->MemoryTesterStyle = 0;
        }
        else {
          this->MemoryTesterStyle = 3;
        }
      }
      else {
        this->MemoryTesterStyle = 2;
      }
    }
    else {
      this->MemoryTesterStyle = 1;
    }
    std::__cxx11::string::~string((string *)local_d8);
  }
  else {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"PurifyCommand",&local_161);
    cmCTest::GetCTestConfiguration(&local_140,pcVar1,&local_160);
    bVar2 = cmsys::SystemTools::FileExists(&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    if (bVar2) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"PurifyCommand",&local_1a9);
      cmCTest::GetCTestConfiguration(&local_188,pcVar1,&local_1a8);
      std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      this->MemoryTesterStyle = 2;
    }
    else {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"ValgrindCommand",&local_1f1);
      cmCTest::GetCTestConfiguration(&local_1d0,pcVar1,&local_1f0);
      bVar2 = cmsys::SystemTools::FileExists(&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      if (bVar2) {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"ValgrindCommand",&local_239);
        cmCTest::GetCTestConfiguration(&local_218,pcVar1,&local_238);
        std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator(&local_239);
        this->MemoryTesterStyle = 1;
      }
      else {
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,"BoundsCheckerCommand",&local_281);
        cmCTest::GetCTestConfiguration(&local_260,pcVar1,&local_280);
        bVar2 = cmsys::SystemTools::FileExists(&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
        if (bVar2) {
          pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c8,"BoundsCheckerCommand",&local_2c9);
          cmCTest::GetCTestConfiguration(&local_2a8,pcVar1,&local_2c8);
          std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::allocator<char>::~allocator(&local_2c9);
          this->MemoryTesterStyle = 3;
        }
      }
    }
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"MemoryCheckType",&local_311);
  cmCTest::GetCTestConfiguration(&local_2f0,pcVar1,&local_310);
  bVar2 = std::operator==(&local_2f0,"AddressSanitizer");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"CMakeCommand",&local_359);
    cmCTest::GetCTestConfiguration(&local_338,pcVar1,&local_358);
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
    this->MemoryTesterStyle = 4;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"MemoryCheckType",&local_3a1);
  cmCTest::GetCTestConfiguration(&local_380,pcVar1,&local_3a0);
  bVar2 = std::operator==(&local_380,"LeakSanitizer");
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"CMakeCommand",&local_3e9);
    cmCTest::GetCTestConfiguration(&local_3c8,pcVar1,&local_3e8);
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    this->MemoryTesterStyle = 5;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"MemoryCheckType",&local_431);
  cmCTest::GetCTestConfiguration(&local_410,pcVar1,&local_430);
  bVar2 = std::operator==(&local_410,"ThreadSanitizer");
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,"CMakeCommand",&local_479);
    cmCTest::GetCTestConfiguration(&local_458,pcVar1,&local_478);
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    this->MemoryTesterStyle = 6;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"MemoryCheckType",&local_4c1);
  cmCTest::GetCTestConfiguration(&local_4a0,pcVar1,&local_4c0);
  bVar2 = std::operator==(&local_4a0,"MemorySanitizer");
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_508,"CMakeCommand",&local_509);
    cmCTest::GetCTestConfiguration(&local_4e8,pcVar1,&local_508);
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator(&local_509);
    this->MemoryTesterStyle = 7;
    this->LogWithPID = true;
  }
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"MemoryCheckType",&local_551);
  cmCTest::GetCTestConfiguration(&local_530,pcVar1,&local_550);
  bVar2 = std::operator==(&local_530,"UndefinedBehaviorSanitizer");
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_598,"CMakeCommand",
               (allocator<char> *)(checkType.field_2._M_local_buf + 0xf));
    cmCTest::GetCTestConfiguration(&local_578,pcVar1,&local_598);
    std::__cxx11::string::operator=((string *)&this->MemoryTester,(string *)&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator((allocator<char> *)(checkType.field_2._M_local_buf + 0xf));
    this->MemoryTesterStyle = 8;
    this->LogWithPID = true;
  }
  if (this->MemoryTesterStyle == 0) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"MemoryCheckType",&local_5e1);
    cmCTest::GetCTestConfiguration((string *)local_5c0,pcVar1,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator(&local_5e1);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_5c0,"Purify");
    if (bVar2) {
      this->MemoryTesterStyle = 2;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_5c0,"BoundsChecker");
      if (bVar2) {
        this->MemoryTesterStyle = 3;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_5c0,"Valgrind");
        if (bVar2) {
          this->MemoryTesterStyle = 1;
        }
      }
    }
    std::__cxx11::string::~string((string *)local_5c0);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_760);
    poVar6 = std::operator<<((ostream *)local_760,
                             "Memory checker (MemoryCheckCommand) not set, or cannot find the specified program."
                            );
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x1fb,pcVar7,
                 (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
    std::__cxx11::string::~string((string *)(memoryTesterOptions.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_760);
    this_local._7_1_ = 0;
    goto LAB_001bf025;
  }
  std::__cxx11::string::string((string *)local_7a0);
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e0,"MemoryCheckCommandOptions",&local_7e1);
  cmCTest::GetCTestConfiguration(&local_7c0,pcVar1,&local_7e0);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  if (((bVar3 ^ 0xff) & 1) == 0) {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_870,"ValgrindCommandOptions",&local_871);
    cmCTest::GetCTestConfiguration(&local_850,pcVar1,&local_870);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_850);
    std::__cxx11::string::~string((string *)&local_870);
    std::allocator<char>::~allocator(&local_871);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b8,"ValgrindCommandOptions",&local_8b9);
      cmCTest::GetCTestConfiguration(&local_898,pcVar1,&local_8b8);
      std::__cxx11::string::operator=((string *)local_7a0,(string *)&local_898);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::allocator<char>::~allocator(&local_8b9);
    }
  }
  else {
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"MemoryCheckCommandOptions",&local_829);
    cmCTest::GetCTestConfiguration(&local_808,pcVar1,&local_828);
    std::__cxx11::string::operator=((string *)local_7a0,(string *)&local_808);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
  }
  cmSystemTools::ParseArguments(&local_8d8,(string *)local_7a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->MemoryTesterOptions,&local_8d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8d8);
  cmCTest::GetBinaryDir_abi_cxx11_
            (&local_918,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
  std::operator+(&local_8f8,&local_918,"/Testing/Temporary/MemoryChecker.??.log");
  std::__cxx11::string::operator=((string *)&this->MemoryTesterOutputFile,(string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_918);
  switch(this->MemoryTesterStyle) {
  case 1:
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->MemoryTesterOptions);
    if (bVar2) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [3])0x965f8e);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [16])"--tool=memcheck");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [17])"--leak-check=yes");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[21]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [21])"--show-reachable=yes");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterOptions,(char (*) [17])"--num-callers=50");
    }
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_958,"MemoryCheckSuppressionFile",&local_959);
    cmCTest::GetCTestConfiguration(&local_938,pcVar1,&local_958);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_938);
    std::__cxx11::string::~string((string *)&local_958);
    std::allocator<char>::~allocator(&local_959);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9a0,"MemoryCheckSuppressionFile",&local_9a1);
      cmCTest::GetCTestConfiguration(&local_980,pcVar1,&local_9a0);
      bVar2 = cmsys::SystemTools::FileExists(&local_980);
      std::__cxx11::string::~string((string *)&local_980);
      std::__cxx11::string::~string((string *)&local_9a0);
      std::allocator<char>::~allocator(&local_9a1);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b20);
        poVar6 = std::operator<<((ostream *)local_b20,
                                 "Cannot find memory checker suppression file: ");
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b60,"MemoryCheckSuppressionFile",&local_b61);
        cmCTest::GetCTestConfiguration(&local_b40,pcVar1,&local_b60);
        poVar6 = std::operator<<(poVar6,(string *)&local_b40);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_b40);
        std::__cxx11::string::~string((string *)&local_b60);
        std::allocator<char>::~allocator(&local_b61);
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x221,pcVar7,false);
        std::__cxx11::string::~string(local_b88);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b20);
        this_local._7_1_ = 0;
        goto LAB_001bf009;
      }
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bf0,"MemoryCheckSuppressionFile",&local_bf1);
      cmCTest::GetCTestConfiguration(&local_bd0,pcVar1,&local_bf0);
      std::operator+(&local_bb0,"--suppressions=",&local_bd0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MemoryTesterOptions,&local_bb0);
      std::__cxx11::string::~string((string *)&local_bb0);
      std::__cxx11::string::~string((string *)&local_bd0);
      std::__cxx11::string::~string((string *)&local_bf0);
      std::allocator<char>::~allocator(&local_bf1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&outputFile.field_2 + 8),"--log-file=",&this->MemoryTesterOutputFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)((long)&outputFile.field_2 + 8));
    std::__cxx11::string::~string((string *)(outputFile.field_2._M_local_buf + 8));
    break;
  case 2:
    std::__cxx11::string::string((string *)(dpbdFile.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)(dpbdFile.field_2._M_local_buf + 8),"-log-file=");
    std::__cxx11::string::operator+=
              ((string *)(dpbdFile.field_2._M_local_buf + 8),(string *)&this->MemoryTesterOutputFile
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)((long)&dpbdFile.field_2 + 8));
    local_b8c = 4;
    std::__cxx11::string::~string((string *)(dpbdFile.field_2._M_local_buf + 8));
    break;
  case 3:
    std::__cxx11::string::operator=
              ((string *)&this->BoundsCheckerXMLFile,(string *)&this->MemoryTesterOutputFile);
    cmCTest::GetBinaryDir_abi_cxx11_
              ((string *)((long)&envVar.field_2 + 8),
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&envVar.field_2 + 8),"/Testing/Temporary/MemoryChecker.??.DPbd");
    std::__cxx11::string::~string((string *)(envVar.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&this->BoundsCheckerDPBDFile,(string *)local_c58);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [3])"/B");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)local_c58);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [3])"/X");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->MemoryTesterDynamicOptions,&this->MemoryTesterOutputFile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterOptions,(char (*) [3])"/M");
    local_b8c = 4;
    std::__cxx11::string::~string((string *)local_c58);
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [3])"-E");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->MemoryTesterDynamicOptions,(char (*) [4])"env");
    std::__cxx11::string::string((string *)(extraOptions.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(suppressionsOption.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_cd8);
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d18,"MemoryCheckSanitizerOptions",&local_d19);
    cmCTest::GetCTestConfiguration(&local_cf8,pcVar1,&local_d18);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_cf8);
    std::__cxx11::string::~string((string *)&local_d18);
    std::allocator<char>::~allocator(&local_d19);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d80,"MemoryCheckSanitizerOptions",&local_d81);
      cmCTest::GetCTestConfiguration(&local_d60,pcVar1,&local_d80);
      std::operator+(&local_d40,":",&local_d60);
      std::__cxx11::string::operator=
                ((string *)(suppressionsOption.field_2._M_local_buf + 8),(string *)&local_d40);
      std::__cxx11::string::~string((string *)&local_d40);
      std::__cxx11::string::~string((string *)&local_d60);
      std::__cxx11::string::~string((string *)&local_d80);
      std::allocator<char>::~allocator(&local_d81);
    }
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dc8,"MemoryCheckSuppressionFile",&local_dc9);
    cmCTest::GetCTestConfiguration(&local_da8,pcVar1,&local_dc8);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_da8);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::allocator<char>::~allocator(&local_dc9);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e30,"MemoryCheckSuppressionFile",
                 (allocator<char> *)(outputFile_1.field_2._M_local_buf + 0xf));
      cmCTest::GetCTestConfiguration(&local_e10,pcVar1,&local_e30);
      std::operator+(&local_df0,":suppressions=",&local_e10);
      std::__cxx11::string::operator=((string *)local_cd8,(string *)&local_df0);
      std::__cxx11::string::~string((string *)&local_df0);
      std::__cxx11::string::~string((string *)&local_e10);
      std::__cxx11::string::~string((string *)&local_e30);
      std::allocator<char>::~allocator((allocator<char> *)(outputFile_1.field_2._M_local_buf + 0xf))
      ;
    }
    if (this->MemoryTesterStyle == 4) {
      std::__cxx11::string::operator=
                ((string *)(extraOptions.field_2._M_local_buf + 8),"ASAN_OPTIONS");
    }
    else if (this->MemoryTesterStyle == 5) {
      std::__cxx11::string::operator=
                ((string *)(extraOptions.field_2._M_local_buf + 8),"LSAN_OPTIONS");
    }
    else if (this->MemoryTesterStyle == 6) {
      std::__cxx11::string::operator=
                ((string *)(extraOptions.field_2._M_local_buf + 8),"TSAN_OPTIONS");
    }
    else if (this->MemoryTesterStyle == 7) {
      std::__cxx11::string::operator=
                ((string *)(extraOptions.field_2._M_local_buf + 8),"MSAN_OPTIONS");
    }
    else if (this->MemoryTesterStyle == 8) {
      std::__cxx11::string::operator=
                ((string *)(extraOptions.field_2._M_local_buf + 8),"UBSAN_OPTIONS");
    }
    std::operator+(&local_e98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&extraOptions.field_2 + 8),"=log_path=\'");
    std::operator+(&local_e78,&local_e98,&this->MemoryTesterOutputFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e58,
                   &local_e78,"\'");
    std::__cxx11::string::~string((string *)&local_e78);
    std::__cxx11::string::~string((string *)&local_e98);
    std::operator+(&local_ed8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cd8);
    std::operator+(&local_eb8,&local_ed8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suppressionsOption.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)&this->MemoryTesterEnvironmentVariable,(string *)&local_eb8);
    std::__cxx11::string::~string((string *)&local_eb8);
    std::__cxx11::string::~string((string *)&local_ed8);
    local_b8c = 4;
    std::__cxx11::string::~string((string *)local_e58);
    std::__cxx11::string::~string((string *)local_cd8);
    std::__cxx11::string::~string((string *)(suppressionsOption.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(extraOptions.field_2._M_local_buf + 8));
    break;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1050);
    poVar6 = std::operator<<((ostream *)local_1050,"Do not understand memory checker: ");
    poVar6 = std::operator<<(poVar6,(string *)&this->MemoryTester);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x289,pcVar7,false);
    std::__cxx11::string::~string(local_1070);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1050);
    this_local._7_1_ = 0;
    goto LAB_001bf009;
  }
  InitializeResultsVectors(this);
  this_local._7_1_ = 1;
LAB_001bf009:
  local_b8c = 1;
  std::__cxx11::string::~string((string *)local_7a0);
LAB_001bf025:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestMemCheckHandler::InitializeMemoryChecking()
{
  this->MemoryTesterEnvironmentVariable.clear();
  this->MemoryTester.clear();
  // Setup the command
  if (cmSystemTools::FileExists(
        this->CTest->GetCTestConfiguration("MemoryCheckCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("MemoryCheckCommand");
    std::string testerName =
      cmSystemTools::GetFilenameName(this->MemoryTester);
    // determine the checker type
    if (testerName.find("valgrind") != std::string::npos ||
        this->CTest->GetCTestConfiguration("MemoryCheckType") == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (testerName.find("purify") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (testerName.find("BC") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::UNKNOWN;
    }
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("PurifyCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("PurifyCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("ValgrindCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("ValgrindCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("BoundsCheckerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("BoundsCheckerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "AddressSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::ADDRESS_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "LeakSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::LEAK_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "ThreadSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::THREAD_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "MemorySanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::MEMORY_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "UndefinedBehaviorSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::UB_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  // Check the MemoryCheckType
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::UNKNOWN) {
    std::string checkType =
      this->CTest->GetCTestConfiguration("MemoryCheckType");
    if (checkType == "Purify") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (checkType == "BoundsChecker") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (checkType == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    }
  }
  if (this->MemoryTester.empty()) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "Memory checker (MemoryCheckCommand) "
                       "not set, or cannot find the specified program."
                         << std::endl,
                       this->Quiet);
    return false;
  }

  // Setup the options
  std::string memoryTesterOptions;
  if (!this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions")
         .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("ValgrindCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("ValgrindCommandOptions");
  }
  this->MemoryTesterOptions =
    cmSystemTools::ParseArguments(memoryTesterOptions);

  this->MemoryTesterOutputFile =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/MemoryChecker.??.log";

  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND: {
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("-q");
        this->MemoryTesterOptions.emplace_back("--tool=memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check=yes");
        this->MemoryTesterOptions.emplace_back("--show-reachable=yes");
        this->MemoryTesterOptions.emplace_back("--num-callers=50");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.push_back(
          "--suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }
      this->MemoryTesterDynamicOptions.push_back("--log-file=" +
                                                 this->MemoryTesterOutputFile);
      break;
    }
    case cmCTestMemCheckHandler::PURIFY: {
      std::string outputFile;
#ifdef _WIN32
      if (this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
            .size()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(
            this->CTest, ERROR_MESSAGE,
            "Cannot find memory checker suppression file: "
              << this->CTest
                   ->GetCTestConfiguration("MemoryCheckSuppressionFile")
                   .c_str()
              << std::endl);
          return false;
        }
        std::string filterFiles = "/FilterFiles=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
        this->MemoryTesterOptions.push_back(filterFiles);
      }
      outputFile = "/SAVETEXTDATA=";
#else
      outputFile = "-log-file=";
#endif
      outputFile += this->MemoryTesterOutputFile;
      this->MemoryTesterDynamicOptions.push_back(outputFile);
      break;
    }
    case cmCTestMemCheckHandler::BOUNDS_CHECKER: {
      this->BoundsCheckerXMLFile = this->MemoryTesterOutputFile;
      std::string dpbdFile = this->CTest->GetBinaryDir() +
        "/Testing/Temporary/MemoryChecker.??.DPbd";
      this->BoundsCheckerDPBDFile = dpbdFile;
      this->MemoryTesterDynamicOptions.emplace_back("/B");
      this->MemoryTesterDynamicOptions.push_back(std::move(dpbdFile));
      this->MemoryTesterDynamicOptions.emplace_back("/X");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      this->MemoryTesterOptions.emplace_back("/M");
      break;
    }
    // these are almost the same but the env var used is different
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
    case cmCTestMemCheckHandler::UB_SANITIZER: {
      // To pass arguments to ThreadSanitizer the environment variable
      // TSAN_OPTIONS is used. This is done with the cmake -E env command.
      // The MemoryTesterDynamicOptions is setup with the -E env
      // Then the MemoryTesterEnvironmentVariable gets the
      // TSAN_OPTIONS string with the log_path in it.
      this->MemoryTesterDynamicOptions.emplace_back("-E");
      this->MemoryTesterDynamicOptions.emplace_back("env");
      std::string envVar;
      std::string extraOptions;
      std::string suppressionsOption;
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions")
             .empty()) {
        extraOptions = ":" +
          this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        suppressionsOption = ":suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
      }
      if (this->MemoryTesterStyle ==
          cmCTestMemCheckHandler::ADDRESS_SANITIZER) {
        envVar = "ASAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::LEAK_SANITIZER) {
        envVar = "LSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::THREAD_SANITIZER) {
        envVar = "TSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::MEMORY_SANITIZER) {
        envVar = "MSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::UB_SANITIZER) {
        envVar = "UBSAN_OPTIONS";
      }
      // Quote log_path with single quotes; see
      // https://bugs.chromium.org/p/chromium/issues/detail?id=467936
      std::string outputFile =
        envVar + "=log_path='" + this->MemoryTesterOutputFile + "'";
      this->MemoryTesterEnvironmentVariable =
        outputFile + suppressionsOption + extraOptions;
      break;
    }
    default:
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Do not understand memory checker: " << this->MemoryTester
                                                      << std::endl);
      return false;
  }

  this->InitializeResultsVectors();
  // std::vector<std::string>::size_type cc;
  // for ( cc = 0; cmCTestMemCheckResultStrings[cc]; cc ++ )
  //   {
  //   this->MemoryTesterGlobalResults[cc] = 0;
  //   }
  return true;
}